

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::Value(Value *this,float v)

{
  Type local_40;
  PackedData local_28;
  
  local_40.category = primitive;
  local_40.arrayElementCategory = invalid;
  local_40.isRef = false;
  local_40.isConstant = false;
  local_40.primitiveType.type = float32;
  local_40.boundingSize = 0;
  local_40.arrayElementBoundingSize = 0;
  local_40.structure.object = (Structure *)0x0;
  Value(this,&local_40);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  getData(&local_28,this);
  PackedData::setAs<float>(&local_28,v);
  return;
}

Assistant:

Value::Value (float    v)  : Value (Type (PrimitiveType::float32))   { getData().setAs (v); }